

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O1

_Bool borg_consume(wchar_t i)

{
  byte bVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  wchar_t *pwVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  pbVar2 = borg_items;
  if (borg_items[(uint)i].aware != true) {
    return false;
  }
  switch(borg_items[(uint)i].tval) {
  case '\x19':
    bVar1 = borg_items[(uint)i].sval;
    wVar5 = (wchar_t)bVar1;
    if (((((sv_scroll_light != (uint)bVar1) && (sv_scroll_monster_confusion != (uint)bVar1)) &&
         (wVar6 = (wchar_t)bVar1, sv_scroll_trap_door_destruction != wVar6)) &&
        ((sv_scroll_satisfy_hunger != wVar6 && (sv_scroll_dispel_undead != wVar6)))) &&
       ((sv_scroll_blessing != wVar6 &&
        ((sv_scroll_holy_chant != wVar5 && (sv_scroll_holy_prayer != wVar5)))))) {
      return false;
    }
    _Var3 = borg_read_scroll(wVar5);
    break;
  case '\x1a':
    bVar1 = borg_items[(uint)i].sval;
    wVar5 = (wchar_t)bVar1;
    if (((((sv_potion_slime_mold != (uint)bVar1) && (sv_potion_cure_light != (uint)bVar1)) &&
         (wVar6 = (wchar_t)bVar1, sv_potion_cure_serious != wVar6)) &&
        (((sv_potion_cure_critical != wVar6 && (sv_potion_healing != wVar6)) &&
         ((sv_potion_star_healing != wVar6 &&
          ((wVar6 = (wchar_t)bVar1, sv_potion_life != wVar6 && (sv_potion_restore_life != wVar6)))))
         ))) && (((sv_potion_restore_mana != wVar6 &&
                  (((sv_potion_heroism != wVar6 && (sv_potion_berserk != wVar6)) &&
                   (sv_potion_resist_heat != wVar6)))) &&
                 (((sv_potion_resist_cold != wVar6 && (sv_potion_infravision != wVar6)) &&
                  (((wVar6 = (wchar_t)bVar1, sv_potion_detect_invis != wVar6 &&
                    ((sv_potion_cure_poison != wVar6 && (sv_potion_speed != wVar6)))) &&
                   (sv_potion_inc_exp != wVar6)))))))) {
      if (sv_potion_inc_str2 == wVar6) {
        if (0x75 < borg.trait[10]) {
          return false;
        }
        if (((uint)borg.trait[0x19] < 5) && ((0x16U >> (borg.trait[0x19] & 0x1fU) & 1) != 0)) {
          return false;
        }
        _Var3 = borg_quaff_potion(wVar6);
        if (_Var3) {
          return true;
        }
      }
      bVar1 = pbVar2[(uint)i].sval;
      wVar5 = (wchar_t)bVar1;
      if (sv_potion_inc_int2 == (uint)bVar1) {
        if (0x75 < borg.trait[0xb]) {
          return false;
        }
        if ((borg.trait[0x19] != 4) && (borg.trait[0x19] != 1)) {
          return false;
        }
      }
      else if (sv_potion_inc_wis2 == (uint)bVar1) {
        if (0x75 < borg.trait[0xc]) {
          return false;
        }
        if ((borg.trait[0x19] & 0xfffffffeU) != 2) {
          return false;
        }
      }
      else if (sv_potion_inc_dex2 == (uint)bVar1) {
        if (0x75 < borg.trait[0xd]) {
          return false;
        }
        if (borg.trait[0x19] - 1U < 4) {
          return false;
        }
      }
      else {
        if (sv_potion_inc_con2 != (uint)bVar1) {
          return false;
        }
        if (0x75 < borg.trait[0xe]) {
          return false;
        }
      }
    }
    _Var3 = borg_quaff_potion(wVar5);
    break;
  default:
    goto switchD_00231bd9_caseD_1b;
  case '\x1c':
    bVar1 = borg_items[(uint)i].sval;
    wVar5 = (wchar_t)bVar1;
    if ((sv_food_ration != (uint)bVar1) && (sv_food_slime_mold != (uint)bVar1)) {
      pwVar4 = &sv_food_waybread;
LAB_00231e7c:
      if (*pwVar4 != wVar5) {
        return false;
      }
    }
    goto LAB_00231e84;
  case '\x1d':
    bVar1 = borg_items[(uint)i].sval;
    wVar5 = (wchar_t)bVar1;
    if ((((((sv_mush_second_sight != (uint)bVar1) && (sv_mush_fast_recovery != (uint)bVar1)) &&
          (wVar6 = (wchar_t)bVar1, sv_mush_cure_mind != wVar6)) &&
         ((sv_mush_restoring != wVar6 && (sv_mush_emergency != wVar6)))) &&
        ((sv_mush_terror != wVar6 &&
         ((wVar6 = (wchar_t)bVar1, sv_mush_stoneskin != wVar6 && (sv_mush_debility != wVar6)))))) &&
       (sv_mush_sprinting != wVar6)) {
      pwVar4 = &sv_mush_purging;
      goto LAB_00231e7c;
    }
LAB_00231e84:
    if (borg.trait[0x6e] != 0) {
      return false;
    }
    _Var3 = borg_eat((uint)borg_items[(uint)i].tval,wVar5);
  }
  if (_Var3 != false) {
    return true;
  }
switchD_00231bd9_caseD_1b:
  return false;
}

Assistant:

static bool borg_consume(int i)
{
    borg_item *item = &borg_items[i];

    if (!item->aware)
        return false;

    /* Special destruction */
    switch (item->tval) {
    case TV_POTION:

        /* Check the potion */
        if (item->sval == sv_potion_slime_mold
            || item->sval == sv_potion_cure_light
            || item->sval == sv_potion_cure_serious
            || item->sval == sv_potion_cure_critical
            || item->sval == sv_potion_healing
            || item->sval == sv_potion_star_healing
            || item->sval == sv_potion_life
            || item->sval == sv_potion_restore_life
            || item->sval == sv_potion_restore_mana
            || item->sval == sv_potion_heroism
            || item->sval == sv_potion_berserk
            || item->sval == sv_potion_resist_heat
            || item->sval == sv_potion_resist_cold
            || item->sval == sv_potion_infravision
            || item->sval == sv_potion_detect_invis
            || item->sval == sv_potion_cure_poison
            || item->sval == sv_potion_speed
            || item->sval == sv_potion_inc_exp) {
            /* Try quaffing the potion */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        /* Gain one/lose one potions */
        if (item->sval == sv_potion_inc_str2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CSTR] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] == CLASS_MAGE
                || borg.trait[BI_CLASS] == CLASS_DRUID
                || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
        }

        if (item->sval == sv_potion_inc_int2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CINT] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] != CLASS_MAGE
                && borg.trait[BI_CLASS] != CLASS_NECROMANCER)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        if (item->sval == sv_potion_inc_wis2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CWIS] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] != CLASS_PRIEST
                && borg.trait[BI_CLASS] != CLASS_DRUID)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        if (item->sval == sv_potion_inc_dex2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CDEX] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] == CLASS_MAGE
                || borg.trait[BI_CLASS] == CLASS_PRIEST
                || borg.trait[BI_CLASS] == CLASS_DRUID
                || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        if (item->sval == sv_potion_inc_con2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CCON] >= 118)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        break;

    case TV_SCROLL:

        /* Check the scroll */
        if (item->sval == sv_scroll_light
            || item->sval == sv_scroll_monster_confusion
            || item->sval == sv_scroll_trap_door_destruction
            || item->sval == sv_scroll_satisfy_hunger
            || item->sval == sv_scroll_dispel_undead
            || item->sval == sv_scroll_blessing
            || item->sval == sv_scroll_holy_chant
            || item->sval == sv_scroll_holy_prayer) {
            /* Try reading the scroll */
            if (borg_read_scroll(item->sval))
                return true;
        }

        break;

    case TV_FOOD:
        /* Check the grub */
        if (item->sval == sv_food_ration 
            || item->sval == sv_food_slime_mold
            || item->sval == sv_food_waybread)

            /* Try eating the food (unless Bloated) */
            if (!borg.trait[BI_ISFULL] && borg_eat(item->tval, item->sval))
                return true;

        break;

    case TV_MUSHROOM:

        /* Check the grub */
        if (item->sval == sv_mush_second_sight
            || item->sval == sv_mush_fast_recovery
            || item->sval == sv_mush_cure_mind
            || item->sval == sv_mush_restoring
            || item->sval == sv_mush_emergency 
            || item->sval == sv_mush_terror
            || item->sval == sv_mush_stoneskin 
            || item->sval == sv_mush_debility
            || item->sval == sv_mush_sprinting 
            || item->sval == sv_mush_purging)

            /* Try eating the food (unless Bloated) */
            if (!borg.trait[BI_ISFULL] && borg_eat(item->tval, item->sval))
                return true;

        break;
    }

    /* Nope */
    return false;
}